

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

Var Js::JavascriptOperators::OP_CloneBlockScope
              (BlockActivationObject *blockScope,ScriptContext *scriptContext)

{
  bool bVar1;
  ThreadContext *pTVar2;
  BlockActivationObject *pBVar3;
  
  pTVar2 = scriptContext->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  pBVar3 = BlockActivationObject::Clone(blockScope,scriptContext);
  pTVar2->noJsReentrancy = bVar1;
  return pBVar3;
}

Assistant:

Var JavascriptOperators::OP_CloneBlockScope(BlockActivationObject *blockScope, ScriptContext *scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(OP_CloneBlockScope, reentrancylock, scriptContext->GetThreadContext());
        return blockScope->Clone(scriptContext);
        JIT_HELPER_END(OP_CloneBlockScope);
    }